

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupMockCheckedActualCall::teardown
          (TEST_GROUP_CppUTestGroupMockCheckedActualCall *this)

{
  TEST_GROUP_CppUTestGroupMockCheckedActualCall *this_local;
  
  CHECK_NO_MOCK_FAILURE_LOCATION
            ("/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x32);
  MockFailureReporterForTest::clearReporter();
  if (this->emptyList != (MockExpectedCallsList *)0x0) {
    (*this->emptyList->_vptr_MockExpectedCallsList[1])();
  }
  if (this->list != (MockExpectedCallsList *)0x0) {
    (*this->list->_vptr_MockExpectedCallsList[1])();
  }
  return;
}

Assistant:

void teardown() _override
    {
        CHECK_NO_MOCK_FAILURE();

        MockFailureReporterForTest::clearReporter();

        delete emptyList;
        delete list;
    }